

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

QList<QAbstractButton_*> * __thiscall
QDialogButtonBoxPrivate::allButtons(QDialogButtonBoxPrivate *this)

{
  long lVar1;
  bool bVar2;
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  *this_00;
  const_iterator *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  reference *it;
  QVarLengthFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_8> *__range1;
  QList<QAbstractButton_*> *ret;
  const_iterator __end1;
  const_iterator __begin1;
  const_iterator *in_stack_ffffffffffffff78;
  const_iterator *this_01;
  QDialogButtonBoxPrivate *in_stack_ffffffffffffffa8;
  containers *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->c)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->i = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].c = (containers *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  visibleButtons(in_stack_ffffffffffffffa8);
  this_00 = (QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
             *)QList<QAbstractButton_*>::size((QList<QAbstractButton_*> *)in_RDI);
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  ::size((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
          *)0x66d6c7);
  QList<QAbstractButton_*>::reserve
            ((QList<QAbstractButton_*> *)in_stack_ffffffffffffffa8,
             (qsizetype)in_stack_ffffffffffffffe8);
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  ::begin(this_00);
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  ::end(this_00);
  while (bVar2 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                 ::const_iterator::operator!=(this_01,in_stack_ffffffffffffff78), bVar2) {
    QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
    ::const_iterator::operator*(in_RSI);
    QList<QAbstractButton_*>::push_back
              ((QList<QAbstractButton_*> *)this_01,(parameter_type)in_stack_ffffffffffffff78);
    QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
    ::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QAbstractButton_*> *)this_01;
}

Assistant:

QList<QAbstractButton *> QDialogButtonBoxPrivate::allButtons() const
{
    QList<QAbstractButton *> ret(visibleButtons());
    ret.reserve(ret.size() + hiddenButtons.size());
    for (const auto &it : hiddenButtons)
        ret.push_back(it.first);
    return ret;
}